

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O0

decNumber_conflict2 * decimal64ToNumber(decimal64 *d64,decNumber_conflict2 *dn)

{
  uint uVar1;
  uint uVar2;
  uint local_44;
  uint local_40;
  uint32_t sourar [2];
  int32_t need;
  uint32_t *pu;
  uint32_t comb;
  uint32_t exp;
  uint32_t msd;
  decNumber_conflict2 *dn_local;
  decimal64 *d64_local;
  
  local_44 = *(uint *)d64->bytes;
  local_40 = *(uint *)(d64->bytes + 4);
  uVar1 = local_40 >> 0x1a & 0x1f;
  unique0x100000f3 = d64;
  decNumberZero((decNumber_conflict *)dn);
  if ((local_40 & 0x80000000) != 0) {
    dn->bits = 0x80;
  }
  comb = COMBMSD[uVar1];
  if (COMBEXP[uVar1] == 3) {
    if (comb == 0) {
      dn->bits = dn->bits | 0x40;
      return dn;
    }
    if ((local_40 & 0x2000000) == 0) {
      dn->bits = dn->bits | 0x20;
    }
    else {
      dn->bits = dn->bits | 0x10;
    }
    comb = 0;
  }
  else {
    dn->exponent = COMBEXP[uVar1] * 0x100 + (local_40 >> 0x12 & 0xff) + -0x18e;
  }
  uVar1 = local_40 & 0x3ffff;
  if (comb == 0) {
    if (uVar1 == 0) {
      if (local_44 == 0) {
        return dn;
      }
      sourar[0] = 3;
      local_40 = uVar1;
      if ((local_44 & 0xc0000000) != 0) {
        sourar[0] = 4;
      }
    }
    else {
      sourar[0] = 4;
      uVar2 = local_40 & 0x3ff00;
      local_40 = uVar1;
      if (uVar2 != 0) {
        sourar[0] = 5;
      }
    }
  }
  else {
    sourar[0] = 6;
    local_40 = comb << 0x12 | uVar1;
  }
  decDigitsFromDPD(dn,&local_44,sourar[0]);
  return dn;
}

Assistant:

decNumber * decimal64ToNumber(const decimal64 *d64, decNumber *dn) {
  uInt msd;			   /* coefficient MSD */
  uInt exp;			   /* exponent top two bits */
  uInt comb;			   /* combination field */
  const uInt *pu;		   /* work */
  Int  need;			   /* .. */
  uInt sourar[2];		   /* source 64-bit */
  #define sourhi sourar[1]	   /* name the word with the sign */
  #define sourlo sourar[0]	   /* and the lower word */

  /* load source from storage; this is endian */
  pu=(const uInt *)d64->bytes;	   /* overlay */
  if (DECLITEND) {
    sourlo=pu[0];		   /* directly load the low int */
    sourhi=pu[1];		   /* then the high int */
    }
   else {
    sourhi=pu[0];		   /* directly load the high int */
    sourlo=pu[1];		   /* then the low int */
    }

  comb=(sourhi>>26)&0x1f;	   /* combination field */

  decNumberZero(dn);		   /* clean number */
  if (sourhi&0x80000000) dn->bits=DECNEG; /* set sign if negative */

  msd=COMBMSD[comb];		   /* decode the combination field */
  exp=COMBEXP[comb];		   /* .. */

  if (exp==3) {			   /* is a special */
    if (msd==0) {
      dn->bits|=DECINF;
      return dn;		   /* no coefficient needed */
      }
    else if (sourhi&0x02000000) dn->bits|=DECSNAN;
    else dn->bits|=DECNAN;
    msd=0;			   /* no top digit */
    }
   else {			   /* is a finite number */
    dn->exponent=(exp<<8)+((sourhi>>18)&0xff)-DECIMAL64_Bias; /* unbiased */
    }

  /* get the coefficient */
  sourhi&=0x0003ffff;		   /* clean coefficient continuation */
  if (msd) {			   /* non-zero msd */
    sourhi|=msd<<18;		   /* prefix to coefficient */
    need=6;			   /* process 6 declets */
    }
   else { /* msd=0 */
    if (!sourhi) {		   /* top word 0 */
      if (!sourlo) return dn;	   /* easy: coefficient is 0 */
      need=3;			   /* process at least 3 declets */
      if (sourlo&0xc0000000) need++; /* process 4 declets */
      /* [could reduce some more, here] */
      }
     else {			   /* some bits in top word, msd=0 */
      need=4;			   /* process at least 4 declets */
      if (sourhi&0x0003ff00) need++; /* top declet!=0, process 5 */
      }
    } /*msd=0 */

  decDigitsFromDPD(dn, sourar, need);	/* process declets */
  return dn;
  }